

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool c4::yml::anon_unknown_0::_is_scalar_next__rseq_rval(csubstr s)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long in_RSI;
  char *in_RDI;
  basic_substring<const_char> local_10;
  
  if (in_RSI != 0) {
    cVar1 = *in_RDI;
    lVar3 = 0;
    do {
      if (cVar1 == "[{!&"[lVar3]) {
        return false;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    if ((in_RSI != 1) && (((cVar1 == '-' || (cVar1 == '?')) && (in_RDI[1] == ' ')))) {
      return false;
    }
  }
  iVar2 = basic_substring<const_char>::compare(&local_10,"-",1);
  return iVar2 != 0;
}

Assistant:

bool _is_scalar_next__rseq_rval(csubstr s)
{
    return !(s.begins_with_any("[{!&") || s.begins_with("? ") || s.begins_with("- ") || s == "-");
}